

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.c
# Opt level: O0

int comex_group_rank(comex_group_t group,int *rank)

{
  int iVar1;
  comex_igroup_t *msg;
  undefined8 in_RSI;
  comex_igroup_t *igroup;
  int status;
  int in_stack_ffffffffffffffdc;
  
  msg = comex_get_igroup_from_group(in_stack_ffffffffffffffdc);
  iVar1 = MPI_Group_rank(msg->group,in_RSI);
  if (iVar1 != 0) {
    comex_error((char *)msg,in_stack_ffffffffffffffdc);
  }
  return 0;
}

Assistant:

int comex_group_rank(comex_group_t group, int *rank)
{
    int status;

    comex_igroup_t *igroup = comex_get_igroup_from_group(group);
    status = MPI_Group_rank(igroup->group, rank);
    if (status != MPI_SUCCESS) {
        comex_error("MPI_Group_rank: Failed ", status);
    }

    return COMEX_SUCCESS;
}